

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::UseInventory(AActor *this,AInventory *item)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AInventory *item_local;
  AActor *this_local;
  
  if (this->health < 1) {
    this_local._7_1_ = false;
  }
  else if ((item->Amount < 1) ||
          (((item->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = AInventory::CallUse(item,false);
    if (bVar1) {
      uVar2 = FIntCVar::operator_cast_to_int(&dmflags2);
      if ((uVar2 & 0x10000) == 0) {
        iVar3 = item->Amount + -1;
        item->Amount = iVar3;
        if (iVar3 < 1) {
          (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])();
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::UseInventory (AInventory *item)
{
	// No using items if you're dead.
	if (health <= 0)
	{
		return false;
	}
	// Don't use it if you don't actually have any of it.
	if (item->Amount <= 0 || (item->ObjectFlags & OF_EuthanizeMe))
	{
		return false;
	}
	if (!item->CallUse (false))
	{
		return false;
	}

	if (dmflags2 & DF2_INFINITE_INVENTORY)
		return true;

	if (--item->Amount <= 0)
	{
		item->DepleteOrDestroy ();
	}
	return true;
}